

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebox.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 in_RAX;
  undefined8 local_18;
  
  local_18 = in_RAX;
  puts("SOEM (Simple Open EtherCAT Master)\nE/BOX test");
  schedp.sched_priority = 0x1e;
  sched_setscheduler(0,1,(sched_param *)&schedp);
  do {
    usleep(1000);
  } while (dorun != 0);
  if (argc < 2) {
    puts("Usage: ebox ifname [cycletime]\nifname = eth0 for example\ncycletime in us");
  }
  else {
    dorun = 1;
    iVar1 = 1000;
    if (argc != 2) {
      iVar1 = atoi(argv[2]);
    }
    local_18._4_4_ = iVar1;
    pthread_create(&thread1,(pthread_attr_t *)0x0,ecatthread,(void *)((long)&local_18 + 4));
    local_18 = CONCAT44(local_18._4_4_,0x28);
    pthread_setschedparam(thread1,0,(sched_param *)&local_18);
    eboxtest(argv[1]);
  }
  schedp.sched_priority = 0;
  sched_setscheduler(0,0,(sched_param *)&schedp);
  puts("End program");
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
   int iret1;
   int ctime;
   struct sched_param    param;
   int                   policy = SCHED_OTHER;
   
   printf("SOEM (Simple Open EtherCAT Master)\nE/BOX test\n");
   
   memset(&schedp, 0, sizeof(schedp));
   /* do not set priority above 49, otherwise sockets are starved */
   schedp.sched_priority = 30;
   sched_setscheduler(0, SCHED_FIFO, &schedp);

   do
   {
      usleep(1000);
   }
   while (dorun);
   
   if (argc > 1)
   {      
      dorun = 1;
      if( argc > 2)
         ctime = atoi(argv[2]);
      else
         ctime = 1000; // 1ms cycle time
      /* create RT thread */
      iret1 = pthread_create( &thread1, NULL, (void *) &ecatthread, (void*) &ctime);   
      memset(&param, 0, sizeof(param));
      /* give it higher priority */
      param.sched_priority = 40;
      iret1 = pthread_setschedparam(thread1, policy, &param);

      /* start acyclic part */
      eboxtest(argv[1]);
   }
   else
   {
      printf("Usage: ebox ifname [cycletime]\nifname = eth0 for example\ncycletime in us\n");
   }   
   
   schedp.sched_priority = 0;
   sched_setscheduler(0, SCHED_OTHER, &schedp);

   printf("End program\n");
   
   return (0);
}